

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O0

void rle_tga_read8(uchar *b,int w,ALLEGRO_FILE *f)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RDX;
  int in_ESI;
  uchar *in_RDI;
  int c;
  int count;
  int value;
  int local_24;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  uchar *local_8;
  
  local_24 = 0;
  local_8 = in_RDI;
  do {
    uVar1 = al_fgetc(in_RDX);
    if ((uVar1 & 0x80) == 0) {
      iVar2 = uVar1 + 1;
      local_8 = raw_tga_read8((uchar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                              (int)((ulong)in_RDX >> 0x20),
                              (ALLEGRO_FILE *)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
    }
    else {
      iVar2 = (uVar1 & 0x7f) + 1;
      iVar3 = iVar2;
      in_stack_ffffffffffffffe4 = al_fgetc(in_RDX);
      while (iVar3 != 0) {
        *local_8 = (uchar)in_stack_ffffffffffffffe4;
        iVar3 = iVar3 + -1;
        local_8 = local_8 + 1;
      }
    }
    local_24 = iVar2 + local_24;
  } while (local_24 < in_ESI);
  return;
}

Assistant:

static void rle_tga_read8(unsigned char *b, int w, ALLEGRO_FILE *f)
{
   int value, count, c = 0;

   do {
      count = al_fgetc(f);
      if (count & 0x80) {
         /* run-length packet */
         count = (count & 0x7F) + 1;
         c += count;
         value = al_fgetc(f);
         while (count--)
            *b++ = value;
      }
      else {
         /* raw packet */
         count++;
         c += count;
         b = raw_tga_read8(b, count, f);
      }
   } while (c < w);
}